

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip.c
# Opt level: O1

void test_read_format_zip_ppmd_one_file(void)

{
  wchar_t wVar1;
  int iVar2;
  uint uVar3;
  archive_conflict *a;
  char *pcVar4;
  archive_entry *ae;
  archive_entry *local_38;
  
  extract_reference_file("test_read_format_zip_ppmd8.zipx");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'ƈ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  wVar1 = archive_read_support_format_zip((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ɖ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_support_format_zip(a)",a);
  wVar1 = archive_read_open_filename(a,"test_read_format_zip_ppmd8.zipx",0x25);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ɗ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_open_filename(a, refname, 37)"
                      ,a);
  iVar2 = archive_read_next_header((archive *)a,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ƌ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_format_name((archive *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'ƌ',"ZIP 6.3 (ppmd-1)","\"ZIP 6.3 (ppmd-1)\"",pcVar4,"archive_format_name(a)",
             (void *)0x0,L'\0');
  pcVar4 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
             ,L'ƍ',"vimrc","\"vimrc\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  uVar3 = extract_one((archive *)a,local_38,0xba8e3baa);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ǝ',0,"0",(ulong)uVar3,"extract_one(a, ae, 0xBA8E3BAA)",a);
  iVar2 = archive_read_next_header((archive *)a,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ə',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",a);
  iVar2 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ɛ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",a);
  iVar2 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ƒ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",a);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_ppmd_one_file)
{
	const char *refname = "test_read_format_zip_ppmd8.zipx";
	struct archive *a;
	struct archive_entry *ae;

	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, refname, 37));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ZIP 6.3 (ppmd-1)", archive_format_name(a));
	assertEqualString("vimrc", archive_entry_pathname(ae));
	assertEqualIntA(a, 0, extract_one(a, ae, 0xBA8E3BAA));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
}